

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

int __thiscall
TPZSparseBlockDiagonal<double>::PutVal
          (TPZSparseBlockDiagonal<double> *this,int64_t row,int64_t col,double *value)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  double *pdVar5;
  double *in_RCX;
  long in_RDI;
  int64_t pos;
  int64_t cblockindex;
  int64_t cblock;
  int64_t rblockindex;
  int64_t rblock;
  int64_t *in_stack_ffffffffffffffb8;
  TPZSparseBlockDiagonal<double> *in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  TPZSparseBlockDiagonal<double> *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  FindBlockIndex(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (int64_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_stack_ffffffffffffffd0 == (TPZSparseBlockDiagonal<double> *)0xffffffffffffffff) {
    local_4 = -1;
  }
  else {
    FindBlockIndex(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                   (int64_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (in_stack_ffffffffffffffc0 == in_stack_ffffffffffffffd0) {
      piVar3 = TPZVec<int>::operator[]
                         ((TPZVec<int> *)(in_RDI + 0x60),(int64_t)in_stack_ffffffffffffffd0);
      iVar2 = *piVar3;
      dVar1 = *in_RCX;
      plVar4 = TPZVec<long>::operator[]
                         ((TPZVec<long> *)(in_RDI + 0x40),(int64_t)in_stack_ffffffffffffffd0);
      pdVar5 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)(in_RDI + 0x20),
                          *plVar4 + in_stack_ffffffffffffffc8 +
                                    (long)in_stack_ffffffffffffffb8 * (long)iVar2);
      *pdVar5 = dVar1;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::PutVal(const int64_t row, const int64_t col, const TVar& value)
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return -1;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return -1;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	this->fStorage[this->fBlockPos[rblock]+pos] = value;
	return 0;
}